

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

string * __thiscall
pbrt::ParameterDictionary::GetOneString(ParameterDictionary *this,string *name,string *def)

{
  string *in_RCX;
  string *in_RDI;
  string local_40 [8];
  ReturnType *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  ParameterDictionary *in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::string(local_40,in_RCX);
  lookupSingle<(pbrt::ParameterType)9>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string ParameterDictionary::GetOneString(const std::string &name,
                                              const std::string &def) const {
    return lookupSingle<ParameterType::String>(name, def);
}